

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_StringCacheKey::Run(void)

{
  char cVar1;
  Template *tpl;
  Template *tpl_00;
  long lVar2;
  string cache_key_a;
  TemplateString local_d8;
  string text;
  TemplateString local_98;
  TemplateDictionary empty_dict;
  
  std::__cxx11::string::string((string *)&cache_key_a,"cache key a",(allocator *)&empty_dict);
  std::__cxx11::string::string((string *)&text,"Test template 1",(allocator *)&empty_dict);
  ctemplate::TemplateString::TemplateString(&local_d8,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&empty_dict,&local_d8,(UnsafeArena *)0x0);
  local_d8.ptr_ = cache_key_a._M_dataplus._M_p;
  local_d8.length_ = cache_key_a._M_string_length;
  local_d8.is_immutable_ = false;
  local_d8.id_ = 0;
  local_98.ptr_ = text._M_dataplus._M_p;
  local_98.length_ = text._M_string_length;
  local_98.is_immutable_ = false;
  local_98.id_ = 0;
  cVar1 = ctemplate::Template::StringToTemplateCache(&local_d8,&local_98);
  if (cVar1 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x47d,"Template::StringToTemplateCache(cache_key_a, text)"
          );
    local_d8.ptr_ = cache_key_a._M_dataplus._M_p;
    local_d8.length_ = cache_key_a._M_string_length;
    local_d8.is_immutable_ = false;
    local_d8.id_ = 0;
    local_98.ptr_ = text._M_dataplus._M_p;
    local_98.length_ = text._M_string_length;
    local_98.is_immutable_ = false;
    local_98.id_ = 0;
    cVar1 = ctemplate::Template::StringToTemplateCache(&local_d8,&local_98);
    if (cVar1 == '\0') {
      __assert_fail("Template::StringToTemplateCache(cache_key_a, text)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x47d,"static void Test_Template_StringCacheKey::Run()");
    }
  }
  else {
    local_d8.ptr_ = cache_key_a._M_dataplus._M_p;
    local_d8.length_ = cache_key_a._M_string_length;
    local_d8.is_immutable_ = false;
    local_d8.id_ = 0;
    tpl = (Template *)ctemplate::Template::GetTemplate(&local_d8,DO_NOT_STRIP);
    ctemplate::AssertExpandIs(tpl,&empty_dict,&text,true);
    local_d8.ptr_ = cache_key_a._M_dataplus._M_p;
    local_d8.length_ = cache_key_a._M_string_length;
    local_d8.is_immutable_ = false;
    local_d8.id_ = 0;
    tpl_00 = (Template *)ctemplate::Template::GetTemplate(&local_d8,STRIP_BLANK_LINES);
    if (tpl_00 != (Template *)0x0) {
      if (tpl_00 != tpl) {
        ctemplate::AssertExpandIs(tpl_00,&empty_dict,&text,true);
        ctemplate::Template::ClearCache();
        ctemplate::TemplateDictionary::~TemplateDictionary(&empty_dict);
        std::__cxx11::string::~string((string *)&text);
        std::__cxx11::string::~string((string *)&cache_key_a);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x483,"tpl2 != tpl1");
      __assert_fail("tpl2 != tpl1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x483,"static void Test_Template_StringCacheKey::Run()");
    }
    printf("ASSERT FAILED, line %d: %s\n",0x482,
           "tpl2 = Template::GetTemplate(cache_key_a, STRIP_BLANK_LINES)");
    local_d8.ptr_ = cache_key_a._M_dataplus._M_p;
    local_d8.length_ = cache_key_a._M_string_length;
    local_d8.is_immutable_ = false;
    local_d8.id_ = 0;
    lVar2 = ctemplate::Template::GetTemplate(&local_d8,STRIP_BLANK_LINES);
    if (lVar2 == 0) {
      __assert_fail("tpl2 = Template::GetTemplate(cache_key_a, STRIP_BLANK_LINES)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x482,"static void Test_Template_StringCacheKey::Run()");
    }
  }
  exit(1);
}

Assistant:

TEST(Template, StringCacheKey) {
  // If you use these same cache keys somewhere else,
  // call Template::ClearCache first.
  const string cache_key_a = "cache key a";
  const string text = "Test template 1";
  TemplateDictionary empty_dict("dict");

  // When a string template is registered via StringToTemplateCache,
  // we can use GetTemplate for that same cache-key under any other
  // Strip because we cache the contents.
  Template *tpl1, *tpl2;
  ASSERT(Template::StringToTemplateCache(cache_key_a, text));
  tpl1 = Template::GetTemplate(cache_key_a, DO_NOT_STRIP);
  AssertExpandIs(tpl1, &empty_dict, text, true);

  // Different strip.
  ASSERT(tpl2 = Template::GetTemplate(cache_key_a, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl1);
  AssertExpandIs(tpl2, &empty_dict, text, true);

  Template::ClearCache();
}